

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O3

void __thiscall
MT32Emu::Partial::startPartial
          (Partial *this,Part *part,Poly *usePoly,PatchCache *usePatchCache,RhythmTemp *rhythmTemp,
          Partial *pairPartial)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar8;
  Synth *this_00;
  PatchCache *pPVar6;
  TVF *this_01;
  PartialParam *newPartialParam;
  Partial *pPVar7;
  bool bVar9;
  uint uVar10;
  Bit32u basePitch;
  PatchTemp *pPVar11;
  Bit8u *pBVar12;
  Tables *pTVar13;
  byte bVar14;
  int iVar15;
  undefined1 *puVar16;
  PCMWaveEntry *pPVar17;
  ulong uVar18;
  undefined8 uVar19;
  LA32PartialPair *pLVar20;
  char *pcVar21;
  char *pcVar22;
  LA32PartialPair **ppLVar23;
  
  if (usePoly == (Poly *)0x0 || usePatchCache == (PatchCache *)0x0) {
    pcVar22 = "OK";
    pcVar21 = "OK";
    if (usePoly == (Poly *)0x0) {
      pcVar21 = "*** NULL ***";
    }
    if (usePatchCache == (PatchCache *)0x0) {
      pcVar22 = "*** NULL ***";
    }
    Synth::printDebug(this->synth,
                      "[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s"
                      ,(ulong)(uint)this->partialIndex,(ulong)(uint)this->ownerPart,pcVar21,pcVar22)
    ;
    return;
  }
  this->patchCache = usePatchCache;
  this->poly = usePoly;
  iVar5 = usePatchCache->structureMix;
  uVar8 = usePatchCache->structurePosition;
  this->mixType = iVar5;
  this->structurePosition = uVar8;
  if (rhythmTemp == (RhythmTemp *)0x0) {
    pPVar11 = Part::getPatchTemp(part);
    pBVar12 = &pPVar11->panpot;
    iVar5 = this->mixType;
  }
  else {
    pBVar12 = &rhythmTemp->panpot;
  }
  bVar3 = *pBVar12;
  if (iVar5 == 3) {
    puVar16 = PAN_NUMERATOR_SLAVE;
    if (this->structurePosition == 0) {
      puVar16 = PAN_NUMERATOR_MASTER;
    }
    cVar4 = puVar16[bVar3];
    this->mixType = 0;
    pairPartial = (Partial *)0x0;
    bVar14 = cVar4 * '\x02';
  }
  else {
    bVar9 = Synth::isNicePanningEnabled(this->synth);
    bVar14 = bVar3 & 0xe;
    if (bVar9) {
      bVar14 = bVar3;
    }
  }
  this_00 = this->synth;
  uVar10 = 0xe - bVar14;
  if (this_00->reversedStereoEnabled == false) {
    uVar10 = (uint)bVar14;
  }
  this->leftPanValue = uVar10;
  this->rightPanValue = 0xe - uVar10;
  if (this->floatMode == false) {
    if (getPanFactor(int)::firstRun == '\0') {
      getPanFactor(int)::firstRun = '\x01';
      iVar5 = 0x4000;
      uVar18 = 0;
      do {
        if (uVar18 < 0xe) {
          *(int *)(getPanFactor(int)::PAN_FACTORS + uVar18 * 4 + 4) =
               (int)((double)(iVar5 + -0x2000) / 14.0 + 0.5);
          *(int *)(getPanFactor(int)::PAN_FACTORS + uVar18 * 4 + 8) =
               (int)((double)iVar5 / 14.0 + 0.5);
        }
        uVar18 = uVar18 + 2;
        iVar5 = iVar5 + 0x4000;
      } while (uVar18 != 0xe);
    }
    this->leftPanValue = *(Bit32s *)(getPanFactor(int)::PAN_FACTORS + (long)(int)uVar10 * 4);
    this->rightPanValue =
         *(Bit32s *)(getPanFactor(int)::PAN_FACTORS + (long)(int)(0xe - uVar10) * 4);
  }
  bVar9 = Synth::isNicePartialMixingEnabled(this_00);
  if ((!bVar9) && ((this->partialIndex & 4) != 0)) {
    uVar1 = this->leftPanValue;
    uVar2 = this->rightPanValue;
    this->leftPanValue = -uVar1;
    this->rightPanValue = -uVar2;
  }
  pPVar6 = this->patchCache;
  iVar5 = 0;
  if (pPVar6->PCMPartial == true) {
    iVar15 = pPVar6->pcm;
    this->pcmNum = iVar15;
    if ((0x80 < this->synth->controlROMMap->pcmCount) && (1 < pPVar6->waveform)) {
      iVar15 = iVar15 + 0x80;
      this->pcmNum = iVar15;
    }
    pPVar17 = this->synth->pcmWaves + iVar15;
  }
  else {
    pPVar17 = (PCMWaveEntry *)0x0;
  }
  this->pcmWave = pPVar17;
  uVar10 = Poly::getVelocity(this->poly);
  bVar3 = (this->patchCache->srcPartial).wg.pulseWidthVeloSensitivity;
  pTVar13 = Tables::getInstance();
  uVar10 = (uint)pTVar13->pulseWidth100To255[(this->patchCache->srcPartial).wg.pulseWidth] +
           (bVar3 - 7) * (uVar10 - 0x40);
  this->pulseWidthVal = uVar10;
  if (((int)uVar10 < 0) || (iVar5 = 0xff, 0xff < uVar10)) {
    this->pulseWidthVal = iVar5;
  }
  this->pair = pairPartial;
  this->alreadyOutputed = false;
  TVA::reset(this->tva,part,this->patchCache->partialParam,rhythmTemp);
  TVP::reset(this->tvp,part,this->patchCache->partialParam);
  this_01 = this->tvf;
  newPartialParam = this->patchCache->partialParam;
  basePitch = TVP::getBasePitch(this->tvp);
  TVF::reset(this_01,newPartialParam,basePitch);
  pPVar7 = this->pair;
  if (this->structurePosition == 1 && pPVar7 != (Partial *)0x0) {
    iVar5 = this->mixType;
    if (iVar5 - 1U < 2) {
      ppLVar23 = &pPVar7->la32Pair;
      uVar19 = 1;
      goto LAB_0018285c;
    }
    pLVar20 = this->la32Pair;
LAB_00182847:
    uVar18 = 0;
  }
  else {
    pLVar20 = this->la32Pair;
    iVar5 = this->mixType;
    if (this->structurePosition != 0 || pPVar7 == (Partial *)0x0) goto LAB_00182847;
    uVar18 = (ulong)CONCAT31((int3)(iVar5 - 1U >> 8),iVar5 - 1U < 2);
  }
  ppLVar23 = &this->la32Pair;
  (*pLVar20->_vptr_LA32PartialPair[2])(pLVar20,uVar18 & 0xff,(ulong)(iVar5 == 1),uVar18);
  uVar19 = 0;
LAB_0018285c:
  pLVar20 = *ppLVar23;
  pPVar17 = this->pcmWave;
  if (pPVar17 == (PCMWaveEntry *)0x0) {
    (*pLVar20->_vptr_LA32PartialPair[3])
              (pLVar20,uVar19,(ulong)(this->patchCache->waveform & 1),
               (ulong)(byte)this->pulseWidthVal,
               (ulong)(byte)((this->patchCache->srcPartial).tvf.resonance + 1));
  }
  else {
    (*pLVar20->_vptr_LA32PartialPair[4])
              (pLVar20,uVar19,this->synth->pcmROMData + pPVar17->addr,(ulong)pPVar17->len,
               (ulong)pPVar17->loop);
  }
  if (((this->pair != (Partial *)0x0) && (this->structurePosition == 0)) && (this->mixType - 1U < 2)
     ) {
    return;
  }
  (*this->la32Pair->_vptr_LA32PartialPair[5])(this->la32Pair,1);
  return;
}

Assistant:

void Partial::startPartial(const Part *part, Poly *usePoly, const PatchCache *usePatchCache, const MemParams::RhythmTemp *rhythmTemp, Partial *pairPartial) {
	if (usePoly == NULL || usePatchCache == NULL) {
		synth->printDebug("[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s", partialIndex, ownerPart, usePoly == NULL ? "*** NULL ***" : "OK", usePatchCache == NULL ? "*** NULL ***" : "OK");
		return;
	}
	patchCache = usePatchCache;
	poly = usePoly;
	mixType = patchCache->structureMix;
	structurePosition = patchCache->structurePosition;

	Bit8u panSetting = rhythmTemp != NULL ? rhythmTemp->panpot : part->getPatchTemp()->panpot;
	if (mixType == 3) {
		if (structurePosition == 0) {
			panSetting = PAN_NUMERATOR_MASTER[panSetting] << 1;
		} else {
			panSetting = PAN_NUMERATOR_SLAVE[panSetting] << 1;
		}
		// Do a normal mix independent of any pair partial.
		mixType = 0;
		pairPartial = NULL;
	} else if (!synth->isNicePanningEnabled()) {
		// Mok wanted an option for smoother panning, and we love Mok.
		// CONFIRMED by Mok: exactly bytes like this (right shifted) are sent to the LA32.
		panSetting &= 0x0E;
	}

	leftPanValue = synth->reversedStereoEnabled ? 14 - panSetting : panSetting;
	rightPanValue = 14 - leftPanValue;

	if (!floatMode) {
		leftPanValue = getPanFactor(leftPanValue);
		rightPanValue = getPanFactor(rightPanValue);
	}

	// SEMI-CONFIRMED: From sample analysis:
	// Found that timbres with 3 or 4 partials (i.e. one using two partial pairs) are mixed in two different ways.
	// Either partial pairs are added or subtracted, it depends on how the partial pairs are allocated.
	// It seems that partials are grouped into quarters and if the partial pairs are allocated in different quarters the subtraction happens.
	// Though, this matters little for the majority of timbres, it becomes crucial for timbres which contain several partials that sound very close.
	// In this case that timbre can sound totally different depending on the way it is mixed up.
	// Most easily this effect can be displayed with the help of a special timbre consisting of several identical square wave partials (3 or 4).
	// Say, it is 3-partial timbre. Just play any two notes simultaneously and the polys very probably are mixed differently.
	// Moreover, the partial allocator retains the last partial assignment it did and all the subsequent notes will sound the same as the last released one.
	// The situation is better with 4-partial timbres since then a whole quarter is assigned for each poly. However, if a 3-partial timbre broke the normal
	// whole-quarter assignment or after some partials got aborted, even 4-partial timbres can be found sounding differently.
	// This behaviour is also confirmed with two more special timbres: one with identical sawtooth partials, and one with PCM wave 02.
	// For my personal taste, this behaviour rather enriches the sounding and should be emulated.
	if (!synth->isNicePartialMixingEnabled() && (partialIndex & 4)) {
		leftPanValue = -leftPanValue;
		rightPanValue = -rightPanValue;
	}

	if (patchCache->PCMPartial) {
		pcmNum = patchCache->pcm;
		if (synth->controlROMMap->pcmCount > 128) {
			// CM-32L, etc. support two "banks" of PCMs, selectable by waveform type parameter.
			if (patchCache->waveform > 1) {
				pcmNum += 128;
			}
		}
		pcmWave = &synth->pcmWaves[pcmNum];
	} else {
		pcmWave = NULL;
	}

	// CONFIRMED: pulseWidthVal calculation is based on information from Mok
	pulseWidthVal = (poly->getVelocity() - 64) * (patchCache->srcPartial.wg.pulseWidthVeloSensitivity - 7) + Tables::getInstance().pulseWidth100To255[patchCache->srcPartial.wg.pulseWidth];
	if (pulseWidthVal < 0) {
		pulseWidthVal = 0;
	} else if (pulseWidthVal > 255) {
		pulseWidthVal = 255;
	}

	pair = pairPartial;
	alreadyOutputed = false;
	tva->reset(part, patchCache->partialParam, rhythmTemp);
	tvp->reset(part, patchCache->partialParam);
	tvf->reset(patchCache->partialParam, tvp->getBasePitch());

	LA32PartialPair::PairType pairType;
	LA32PartialPair *useLA32Pair;
	if (isRingModulatingSlave()) {
		pairType = LA32PartialPair::SLAVE;
		useLA32Pair = pair->la32Pair;
	} else {
		pairType = LA32PartialPair::MASTER;
		la32Pair->init(hasRingModulatingSlave(), mixType == 1);
		useLA32Pair = la32Pair;
	}
	if (isPCM()) {
		useLA32Pair->initPCM(pairType, &synth->pcmROMData[pcmWave->addr], pcmWave->len, pcmWave->loop);
	} else {
		useLA32Pair->initSynth(pairType, (patchCache->waveform & 1) != 0, pulseWidthVal, patchCache->srcPartial.tvf.resonance + 1);
	}
	if (!hasRingModulatingSlave()) {
		la32Pair->deactivate(LA32PartialPair::SLAVE);
	}
}